

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtThreads.cpp
# Opt level: O2

cbtITaskScheduler * cbtGetOpenMPTaskScheduler(void)

{
  return (cbtITaskScheduler *)0x0;
}

Assistant:

cbtITaskScheduler* cbtGetOpenMPTaskScheduler()
{
#if BT_USE_OPENMP && BT_THREADSAFE
	static cbtTaskSchedulerOpenMP sTaskScheduler;
	return &sTaskScheduler;
#else
	return NULL;
#endif
}